

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

bool __thiscall bloom_filter::contains(bloom_filter *this,uchar *key_begin,size_t length)

{
  ulong uVar1;
  size_t remaining_length;
  size_t begin;
  size_type sVar2;
  const_reference pvVar3;
  byte *pbVar4;
  bloom_type local_44;
  ulong local_40;
  size_t i;
  size_t bit;
  size_t bit_index;
  size_t length_local;
  uchar *key_begin_local;
  bloom_filter *this_local;
  
  bit = 0;
  i = 0;
  local_40 = 0;
  bit_index = length;
  length_local = (size_t)key_begin;
  key_begin_local = (uchar *)this;
  while( true ) {
    uVar1 = local_40;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->salt_);
    begin = length_local;
    remaining_length = bit_index;
    if (sVar2 <= uVar1) {
      return true;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->salt_,local_40);
    local_44 = hash_ap(this,(uchar *)begin,remaining_length,*pvVar3);
    (*this->_vptr_bloom_filter[4])(this,&local_44,&bit,&i);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->bit_table_,bit >> 3);
    if ((*pbVar4 & bit_mask[i]) != bit_mask[i]) break;
    local_40 = local_40 + 1;
  }
  return false;
}

Assistant:

inline virtual bool contains(const unsigned char* key_begin, const std::size_t length) const
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         if ((bit_table_[bit_index / bits_per_char] & bit_mask[bit]) != bit_mask[bit])
         {
            return false;
         }
      }

      return true;
   }